

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

Result __thiscall
ruckig::Calculator<3UL,_ruckig::StandardVector>::calculate<false>
          (Calculator<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *input,
          Trajectory<3UL,_ruckig::StandardVector> *trajectory,double delta_time,
          bool *was_interrupted)

{
  bool bVar1;
  Result local_34;
  Result result;
  bool *was_interrupted_local;
  double delta_time_local;
  Trajectory<3UL,_ruckig::StandardVector> *trajectory_local;
  InputParameter<3UL,_ruckig::StandardVector> *input_local;
  Calculator<3UL,_ruckig::StandardVector> *this_local;
  
  bVar1 = use_waypoints_trajectory(this,input);
  if (bVar1) {
    local_34 = WaypointsCalculator<3UL,_ruckig::StandardVector>::calculate<false>
                         (&this->waypoints_calculator,input,trajectory,delta_time,was_interrupted);
  }
  else {
    local_34 = TargetCalculator<3UL,_ruckig::StandardVector>::calculate<false>
                         (&this->target_calculator,input,trajectory,delta_time,was_interrupted);
  }
  return local_34;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& input, Trajectory<DOFs, CustomVector>& trajectory, double delta_time, bool& was_interrupted) {
        Result result;
#if defined WITH_CLOUD_CLIENT
        if (use_waypoints_trajectory(input)) {
            result = waypoints_calculator.template calculate<throw_error>(input, trajectory, delta_time, was_interrupted);
        } else {
            result = target_calculator.template calculate<throw_error>(input, trajectory, delta_time, was_interrupted);
        }
#else
        result = target_calculator.template calculate<throw_error>(input, trajectory, delta_time, was_interrupted);
#endif

        return result;
    }